

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_escaped_char<char,fmt::v10::appender>(appender out,char v)

{
  bool bVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *pbVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_68;
  value_type_conflict local_59;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_58;
  find_escape_result<char> local_50;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_38;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_30;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_28;
  value_type_conflict local_1b;
  char local_1a;
  char local_19;
  char v_array [1];
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_18;
  char v_local;
  appender out_local;
  
  local_1b = '\'';
  local_1a = v;
  local_19 = v;
  bStack_18 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_28.container = (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
  pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_28);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_1b);
  bVar1 = needs_escape((int)local_19);
  if (((bVar1) && (local_19 != '\"')) || (local_19 == '\'')) {
    local_38.container = bStack_18.container;
    local_50.begin = &local_1a;
    local_50.end = &local_19;
    local_50.cp = (uint32_t)local_19;
    local_30.container =
         (buffer<char> *)write_escaped_cp<fmt::v10::appender,char>(bStack_18.container,&local_50);
    bStack_18.container = local_30.container;
  }
  else {
    local_58.container =
         (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
    pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_58);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_19);
  }
  local_59 = '\'';
  local_68.container = (buffer<char> *)appender::operator++((appender *)&stack0xffffffffffffffe8,0);
  pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_68);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_59);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bStack_18.container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}